

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O0

void duckdb::FixedSizeScan<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  Vector *in_RCX;
  undefined8 in_RDX;
  Vector *in_RSI;
  ColumnSegment *in_RDI;
  data_ptr_t source_data;
  data_ptr_t data;
  idx_t start;
  FixedSizeScanState *scan_state;
  SegmentScanState *in_stack_ffffffffffffffc0;
  VectorType vector_type_p;
  
  vector_type_p = (VectorType)((ulong)in_RDX >> 0x38);
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffffc0);
  SegmentScanState::Cast<duckdb::FixedSizeScanState>(in_stack_ffffffffffffffc0);
  iVar1 = ColumnSegment::GetRelativeIndex
                    (in_RDI,(idx_t)(in_RSI->type).type_info_.internal.
                                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
  pdVar2 = BufferHandle::Ptr((BufferHandle *)0xa41f09);
  iVar3 = ColumnSegment::GetBlockOffset(in_RDI);
  pdVar2 = pdVar2 + iVar1 * 0x10 + iVar3;
  Vector::SetVectorType(in_RSI,vector_type_p);
  FlatVector::SetData(in_RCX,pdVar2);
  return;
}

Assistant:

void FixedSizeScan(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result) {
	auto &scan_state = state.scan_state->template Cast<FixedSizeScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto source_data = data + start * sizeof(T);

	result.SetVectorType(VectorType::FLAT_VECTOR);
	FlatVector::SetData(result, source_data);
}